

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestMultiProcessHandler::SetTests
          (cmCTestMultiProcessHandler *this,TestMap *tests,PropertiesMap *properties)

{
  bool bVar1;
  bool bVar2;
  
  std::
  map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
  ::operator=(&(this->PendingTests).
               super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
              ,&tests->
                super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
             );
  std::
  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ::operator=(&(this->Properties).
               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ,&properties->
                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
             );
  this->Total = (this->PendingTests).
                super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_node_count;
  bVar1 = cmCTest::GetShowOnly(this->CTest);
  bVar2 = true;
  if (!bVar1) {
    ReadCostData(this);
    bVar2 = CheckCycles(this);
    this->HasCycles = !bVar2;
    bVar1 = CheckGeneratedResourceSpec(this);
    this->HasInvalidGeneratedResourceSpec = !bVar1;
    bVar2 = false;
    if ((bVar1) && (bVar2 = false, this->HasCycles == false)) {
      CreateTestCostList(this);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool cmCTestMultiProcessHandler::SetTests(TestMap tests,
                                          PropertiesMap properties)
{
  this->PendingTests = std::move(tests);
  this->Properties = std::move(properties);
  this->Total = this->PendingTests.size();
  if (!this->CTest->GetShowOnly()) {
    this->ReadCostData();
    this->HasCycles = !this->CheckCycles();
    this->HasInvalidGeneratedResourceSpec =
      !this->CheckGeneratedResourceSpec();
    if (this->HasCycles || this->HasInvalidGeneratedResourceSpec) {
      return false;
    }
    this->CreateTestCostList();
  }
  return true;
}